

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O3

void __thiscall OpenDataServerCommand::doCommand(OpenDataServerCommand *this)

{
  ulong uVar1;
  pointer *pppPVar2;
  pointer *pppDVar3;
  long lVar4;
  iterator __position;
  iterator __position_00;
  unsigned_long uVar5;
  DataReaderServer *this_00;
  undefined8 uVar6;
  long lVar7;
  size_type *unaff_R12;
  pointer unaff_R13;
  double dVar8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  pthread_t local_b8;
  pthread_t tId;
  string portStr;
  DataReaderServer *temp;
  ExpressionUtils expUtils;
  string perSecStr;
  Params *params;
  int local_38;
  int local_34;
  int port;
  int perSec;
  
  uVar5 = DataCommands::getIndex(this->dataCommands);
  temp = (DataReaderServer *)0x0;
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,this->dataCommands);
  uVar1 = uVar5 + 1;
  if (uVar1 < (ulong)((long)perSecStr._M_dataplus._M_p -
                      (long)expUtils.deathMap.
                            super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 5)) {
    unaff_R12 = &portStr._M_string_length;
    tId = (pthread_t)unaff_R12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tId,
               expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[uVar1 * 4],
               (long)&expUtils.deathMap.
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[uVar1 * 4]->_vptr_Expression +
               (long)&expUtils.deathMap.
                      super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[uVar1 * 4 + 1]->_vptr_Expression);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    DataVars::getSymbolTable_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&local_128,this->dataVars);
    dVar8 = ExpressionUtils::calculateInfixStr
                      ((ExpressionUtils *)&temp,(string *)&tId,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *)&local_128);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_128);
    local_38 = (int)dVar8;
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&perSecStr.field_2 + 8),this->dataCommands);
    if (uVar5 + 2 < (ulong)((long)params - perSecStr.field_2._8_8_ >> 5)) {
      lVar7 = (uVar5 + 2) * 0x20;
      lVar4 = *(long *)(perSecStr.field_2._8_8_ + lVar7);
      expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&perSecStr._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,lVar4,
                 *(long *)(perSecStr.field_2._8_8_ + 8 + lVar7) + lVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&perSecStr.field_2 + 8));
      DataVars::getSymbolTable_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)&local_f0,this->dataVars);
      dVar8 = ExpressionUtils::calculateInfixStr
                        ((ExpressionUtils *)&temp,
                         (string *)
                         &expUtils.deathMap.
                          super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          *)&local_f0);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0);
      local_34 = (int)dVar8;
      perSecStr.field_2._8_8_ = operator_new(8);
      ((Params *)perSecStr.field_2._8_8_)->dataReaderServer = (DataReaderServer *)0x0;
      __position._M_current =
           (this->deathMap2).
           super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->deathMap2).
          super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenDataServerCommand::Params*,std::allocator<OpenDataServerCommand::Params*>>::
        _M_realloc_insert<OpenDataServerCommand::Params*const&>
                  ((vector<OpenDataServerCommand::Params*,std::allocator<OpenDataServerCommand::Params*>>
                    *)&this->deathMap2,__position,(Params **)((long)&perSecStr.field_2 + 8));
      }
      else {
        *__position._M_current = (Params *)perSecStr.field_2._8_8_;
        pppPVar2 = &(this->deathMap2).
                    super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar2 = *pppPVar2 + 1;
      }
      this_00 = (DataReaderServer *)operator_new(0x40);
      DataReaderServer::DataReaderServer
                (this_00,&local_38,&local_34,this->dataBinds,this->dataVars,&this->mutex);
      *(DataReaderServer **)perSecStr.field_2._8_8_ = this_00;
      __position_00._M_current =
           (this->deathMap1).
           super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      portStr.field_2._8_8_ = this_00;
      if (__position_00._M_current ==
          (this->deathMap1).
          super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DataReaderServer*,std::allocator<DataReaderServer*>>::
        _M_realloc_insert<DataReaderServer*const&>
                  ((vector<DataReaderServer*,std::allocator<DataReaderServer*>> *)&this->deathMap1,
                   __position_00,(DataReaderServer **)((long)&portStr.field_2 + 8));
      }
      else {
        *__position_00._M_current = this_00;
        pppDVar3 = &(this->deathMap1).
                    super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppDVar3 = *pppDVar3 + 1;
      }
      pthread_create(&local_b8,(pthread_attr_t *)0x0,openServer_thread_callback,
                     (void *)perSecStr.field_2._8_8_);
      DataCommands::setIndex(this->dataCommands,uVar5 + 3);
      if (expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)&perSecStr._M_string_length) {
        operator_delete(expUtils.deathMap.
                        super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,perSecStr._M_string_length + 1);
      }
      if ((size_type *)tId != unaff_R12) {
        operator_delete((void *)tId,portStr._M_string_length + 1);
      }
      ExpressionUtils::~ExpressionUtils((ExpressionUtils *)&temp);
      return;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != unaff_R13) {
    operator_delete(expUtils.deathMap.
                    super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,perSecStr._M_string_length + 1);
  }
  if ((size_type *)tId != unaff_R12) {
    operator_delete((void *)tId,portStr._M_string_length + 1);
  }
  ExpressionUtils::~ExpressionUtils((ExpressionUtils *)&temp);
  _Unwind_Resume(uVar6);
}

Assistant:

void OpenDataServerCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    ExpressionUtils expUtils;

    // get the port from the vector in dataCommands
    string portStr = this->dataCommands->getSeparated().at(index);
    // skip the port
    index++;
    int port = static_cast<int>(expUtils.calculateInfixStr(portStr, this->dataVars->getSymbolTable()));

    // get the perSec from the vector in dataCommands
    string perSecStr = this->dataCommands->getSeparated().at(index);
    // skip the perSec
    index++;
    int perSec = static_cast<int>(expUtils.calculateInfixStr(perSecStr, this->dataVars->getSymbolTable()));

    // create a struct of the thread params
    struct Params *params;
    params = new Params();
    this->deathMap2.push_back(params);

    DataReaderServer* temp;
    temp = new DataReaderServer(port, perSec, this->dataBinds, this->dataVars, this->mutex);
    // put values into the params
    params->dataReaderServer = temp;
    this->deathMap1.push_back(temp);

    pthread_t tId;
    // Launch a thread
    pthread_create(&tId, nullptr, openServer_thread_callback, params);

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}